

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verify_certificate_chain.cc
# Opt level: O1

void bssl::anon_unknown_12::VerifyExtendedKeyUsage
               (ParsedCertificate *cert,KeyPurpose required_key_purpose,CertErrors *errors,
               bool is_target_cert,bool is_target_cert_issuer)

{
  Span<const_unsigned_char> *pSVar1;
  bool bVar2;
  bool bVar3;
  byte bVar4;
  byte bVar5;
  long lVar6;
  ulong uVar7;
  undefined **ppuVar8;
  byte bVar9;
  undefined7 in_register_00000009;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  undefined7 in_register_00000081;
  undefined4 uVar15;
  byte bVar16;
  Input *key_purpose_oid;
  Span<const_unsigned_char> *pSVar17;
  Input rhs;
  Input rhs_00;
  Input rhs_01;
  Input rhs_02;
  Input rhs_03;
  Input rhs_04;
  Input rhs_05;
  Input rhs_06;
  Input rhs_07;
  anon_class_16_2_fb8ee566 add_error_if_strict;
  KeyPurpose local_7c;
  CertErrors *local_78;
  uint local_70;
  uint local_6c;
  uint local_68;
  uint local_64;
  undefined8 local_60;
  uint local_58;
  undefined4 local_54;
  ParsedCertificate *local_50;
  Span<const_unsigned_char> *local_48;
  anon_class_16_2_fb8ee566 local_40;
  
  uVar7 = CONCAT71(in_register_00000009,is_target_cert);
  if (required_key_purpose == ANY_EKU) {
    return;
  }
  bVar2 = true;
  bVar16 = 0;
  local_7c = required_key_purpose;
  local_78 = errors;
  if (cert->has_extended_key_usage_ == true) {
    pSVar17 = &((cert->extended_key_usage_).
                super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>._M_impl.
                super__Vector_impl_data._M_start)->data_;
    pSVar1 = &((cert->extended_key_usage_).
               super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>._M_impl.
               super__Vector_impl_data._M_finish)->data_;
    local_50 = cert;
    if (pSVar17 == pSVar1) {
      bVar16 = 0;
      uVar12 = 0;
      bVar3 = false;
      uVar11 = 0;
      uVar13 = 0;
      local_60 = (ulong)local_60._4_4_ << 0x20;
      uVar14 = 0;
      local_70 = 0;
    }
    else {
      local_58 = (uint)uVar7;
      local_54 = (undefined4)CONCAT71(in_register_00000081,is_target_cert_issuer);
      lVar6 = 1;
      uVar10 = 0;
      local_64 = 0;
      uVar15 = 0;
      local_68 = 0;
      local_6c = 0;
      bVar3 = false;
      bVar9 = 0;
      uVar12 = 0;
      bVar16 = 0;
      local_48 = pSVar1;
      do {
        rhs.data_.size_ = 4;
        rhs.data_.data_ = "U\x1d%";
        local_70 = uVar12;
        local_60 = lVar6;
        bVar2 = bssl::der::operator==((Input)*pSVar17,rhs);
        if (bVar2) {
          uVar10 = 1;
        }
        rhs_00.data_.size_ = 8;
        rhs_00.data_.data_ = "+\x06\x01\x05\x05\a\x03\x01+\x06\x01\x05\x05\a\x03\x02GeneralNames";
        bVar2 = bssl::der::operator==((Input)*pSVar17,rhs_00);
        local_64 = local_64 & 0xff;
        if (bVar2) {
          local_64 = 1;
        }
        rhs_01.data_.size_ = 8;
        rhs_01.data_.data_ = "+\x06\x01\x05\x05\a\x03\x02GeneralNames";
        bVar2 = bssl::der::operator==((Input)*pSVar17,rhs_01);
        if (bVar2) {
          uVar15 = 1;
        }
        rhs_02.data_.size_ = 8;
        rhs_02.data_.data_ = (uchar *)&kCodeSigning;
        bVar2 = bssl::der::operator==((Input)*pSVar17,rhs_02);
        local_68 = local_68 & 0xff;
        if (bVar2) {
          local_68 = 1;
        }
        rhs_03.data_.size_ = 8;
        rhs_03.data_.data_ = (uchar *)&kTimeStamping;
        bVar2 = bssl::der::operator==((Input)*pSVar17,rhs_03);
        local_6c = local_6c & 0xff;
        if (bVar2) {
          local_6c = 1;
        }
        rhs_04.data_.size_ = 8;
        rhs_04.data_.data_ = "+\x06\x01\x05\x05\a\x03\tSerial number is not a valid INTEGER";
        bVar2 = bssl::der::operator==((Input)*pSVar17,rhs_04);
        if (bVar2) {
          bVar3 = true;
        }
        rhs_05.data_.size_ = 6;
        rhs_05.data_.data_ = (uchar *)&kRcsMlsClient;
        bVar2 = bssl::der::operator==((Input)*pSVar17,rhs_05);
        if (bVar2) {
          bVar9 = 1;
        }
        rhs_06.data_.size_ = 8;
        rhs_06.data_.data_ =
             "+\x06\x01\x05\x05\a\x03\x04+\x06\x01\x05\x05\a\x03$/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/verify_certificate_chain.cc"
        ;
        bVar2 = bssl::der::operator==((Input)*pSVar17,rhs_06);
        if (bVar2) {
          bVar16 = 1;
        }
        rhs_07.data_.size_ = 8;
        rhs_07.data_.data_ =
             "+\x06\x01\x05\x05\a\x03$/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/verify_certificate_chain.cc"
        ;
        bVar2 = bssl::der::operator==((Input)*pSVar17,rhs_07);
        uVar12 = local_70 & 0xff;
        if (bVar2) {
          uVar12 = 1;
        }
        pSVar17 = pSVar17 + 1;
        lVar6 = local_60 + -1;
      } while (pSVar17 != local_48);
      local_60 = CONCAT44(local_60._4_4_,uVar15);
      bVar2 = (bool)(bVar9 ^ 1 | lVar6 != 0);
      is_target_cert_issuer = SUB41(local_54,0);
      uVar7 = (ulong)local_58;
      cert = local_50;
      uVar14 = local_64;
      uVar11 = local_6c;
      uVar13 = local_68;
      local_70 = uVar10;
    }
  }
  else {
    uVar12 = 0;
    bVar3 = false;
    uVar11 = 0;
    uVar13 = 0;
    local_60 = (ulong)local_60._4_4_ << 0x20;
    uVar14 = 0;
    local_70 = 0;
  }
  bVar9 = (byte)uVar7;
  switch(local_7c) {
  case CLIENT_AUTH_STRICT_LEAF:
    if (bVar9 == 0) {
      local_7c = CLIENT_AUTH;
    }
    else {
      local_7c = CLIENT_AUTH_STRICT;
    }
  default:
    if (local_7c == SERVER_AUTH_STRICT_LEAF) {
      if (bVar9 == 0) {
        local_7c = SERVER_AUTH;
      }
      else {
        local_7c = SERVER_AUTH_STRICT;
      }
    }
    local_40.required_key_purpose = &local_7c;
    local_40.errors = &local_78;
    if (bVar9 == 0) {
      if ((is_target_cert_issuer != false) && (cert->has_extended_key_usage_ == true)) {
        if ((uVar13 & 1) != 0) {
          VerifyExtendedKeyUsage::anon_class_16_2_fb8ee566::operator()
                    (&local_40,
                     "The extended key usage includes code signing which is not permitted for this use"
                    );
        }
        if ((uVar11 & 1) != 0) {
          VerifyExtendedKeyUsage::anon_class_16_2_fb8ee566::operator()
                    (&local_40,
                     "The extended key usage includes time stamping which is not permitted for this use"
                    );
        }
      }
    }
    else if (cert->has_extended_key_usage_ == false) {
      CertErrors::AddWarning(local_78,"Certificate does not have extended key usage");
    }
    else {
      if ((uVar13 & 1) != 0) {
        if ((local_7c == CLIENT_AUTH_STRICT) || (local_7c == SERVER_AUTH_STRICT)) {
          CertErrors::AddError
                    (local_78,
                     "The extended key usage includes code signing which is not permitted for this use"
                    );
        }
        else {
          CertErrors::AddWarning
                    (local_78,
                     "The extended key usage includes code signing which is not permitted for this use"
                    );
        }
      }
      if (bVar3) {
        if ((local_7c == CLIENT_AUTH_STRICT) || (local_7c == SERVER_AUTH_STRICT)) {
          CertErrors::AddError
                    (local_78,
                     "The extended key usage includes OCSP signing which is not permitted for this use"
                    );
        }
        else {
          CertErrors::AddWarning
                    (local_78,
                     "The extended key usage includes OCSP signing which is not permitted for this use"
                    );
        }
      }
      if ((uVar11 & 1) != 0) {
        if ((local_7c == CLIENT_AUTH_STRICT) || (local_7c == SERVER_AUTH_STRICT)) {
          CertErrors::AddError
                    (local_78,
                     "The extended key usage includes time stamping which is not permitted for this use"
                    );
        }
        else {
          CertErrors::AddWarning
                    (local_78,
                     "The extended key usage includes time stamping which is not permitted for this use"
                    );
        }
      }
    }
    if (local_7c < (C2PA_TIMESTAMPING|CLIENT_AUTH)) {
      bVar16 = (byte)local_70;
      if ((10U >> (local_7c & 0x1f) & 1) == 0) {
        if ((0x24U >> (local_7c & 0x1f) & 1) == 0) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/verify_certificate_chain.cc"
                        ,0x1a6,
                        "void bssl::(anonymous namespace)::VerifyExtendedKeyUsage(const ParsedCertificate &, KeyPurpose, CertErrors *, bool, bool)"
                       );
        }
        uVar7 = local_60 & 0xffffffff;
        if ((((local_70 & 1) != 0) && ((local_60 & 1) == 0)) &&
           (uVar7 = 1, (bVar9 | is_target_cert_issuer) == 1)) {
          CertErrors::AddWarning
                    (local_78,
                     "The extended key usage does not include client auth but instead includes anyExtendedKeyUsage"
                    );
          uVar7 = local_60 & 0xffffffff;
        }
        if (local_7c == CLIENT_AUTH) {
          uVar7 = (ulong)(byte)((byte)uVar7 | bVar16 | ~cert->has_extended_key_usage_);
        }
        if ((uVar7 & 1) != 0) {
          return;
        }
        ppuVar8 = &cert_errors::kEkuLacksClientAuth;
      }
      else {
        bVar4 = (byte)uVar14;
        bVar5 = bVar4;
        if ((((local_70 & 1) != 0) && ((uVar14 & 1) == 0)) &&
           (bVar5 = 1, (bVar9 | is_target_cert_issuer) == 1)) {
          CertErrors::AddWarning
                    (local_78,
                     "The extended key usage does not include server auth but instead includes anyExtendeKeyUsage"
                    );
          bVar5 = bVar4;
        }
        bVar9 = 1;
        if ((cert->has_extended_key_usage_ & 1U) != 0) {
          bVar9 = bVar5;
        }
        if (is_target_cert_issuer == false) {
          bVar9 = bVar5;
        }
        if (local_7c == SERVER_AUTH) {
          bVar9 = ~cert->has_extended_key_usage_ | bVar16 | bVar9;
        }
        if ((bVar9 & 1) != 0) {
          return;
        }
        ppuVar8 = &cert_errors::kEkuLacksServerAuth;
      }
      CertErrors::AddError(local_78,*ppuVar8);
    }
    return;
  case RCS_MLS_CLIENT_AUTH:
    if (bVar9 != 0) {
      if ((cert->has_key_usage_ == true) &&
         (bVar3 = bssl::der::BitString::AssertsBit(&cert->key_usage_,0), bVar3)) {
        if (cert->has_key_usage_ == false) {
          abort();
        }
        if (((cert->key_usage_).bytes_.data_.size_ == 1) &&
           ((cert->key_usage_).unused_bits_ == '\a')) goto LAB_004c2688;
      }
      CertErrors::AddError
                (local_78,
                 "KeyUsage must have only the digitalSignature bit set for rcsMlsClient auth");
    }
LAB_004c2688:
    if (cert->has_extended_key_usage_ == false) {
      ppuVar8 = &cert_errors::kEkuNotPresent;
    }
    else {
      if (!bVar2) {
        return;
      }
      ppuVar8 = &cert_errors::kEkuIncorrectForRcsMlsClient;
    }
    break;
  case C2PA_TIMESTAMPING:
    if (bVar9 == 0) {
      return;
    }
    if (cert->has_extended_key_usage_ == false) {
      CertErrors::AddError(local_78,"Certificate does not have extended key usage");
    }
    if (((((byte)uVar12 | bVar16 | (byte)local_70 | bVar3) & 1) == 0) &&
       ((((byte)uVar11 ^ 1) & 1) == 0)) {
      return;
    }
    ppuVar8 = &cert_errors::kEkuIncorrectForC2PATimeStamping;
    break;
  case C2PA_MANIFEST:
    if (bVar9 == 0) {
      return;
    }
    if (cert->has_extended_key_usage_ == false) {
      CertErrors::AddError(local_78,"Certificate does not have extended key usage");
    }
    if (((cert->has_key_usage_ == true) &&
        (bVar2 = bssl::der::BitString::AssertsBit(&cert->key_usage_,0),
        (((byte)local_70 | bVar3 | (byte)uVar11 | ~bVar2) & 1) == 0)) &&
       (bVar16 != 0 || (uVar12 & 1) != 0)) {
      return;
    }
    ppuVar8 = &cert_errors::kEkuIncorrectForC2PAManifest;
  }
  CertErrors::AddError(local_78,*ppuVar8);
  return;
}

Assistant:

void VerifyExtendedKeyUsage(const ParsedCertificate &cert,
                            KeyPurpose required_key_purpose, CertErrors *errors,
                            bool is_target_cert, bool is_target_cert_issuer) {
  // We treat a required KeyPurpose of ANY_EKU to mean "Do not check EKU"
  if (required_key_purpose == KeyPurpose::ANY_EKU) {
    return;
  }
  bool has_any_eku = false;
  bool has_server_auth_eku = false;
  bool has_client_auth_eku = false;
  bool has_code_signing_eku = false;
  bool has_time_stamping_eku = false;
  bool has_ocsp_signing_eku = false;
  bool has_rcs_mls_client_eku = false;
  bool has_document_signing_eku = false;
  bool has_email_protection_eku = false;
  size_t eku_oid_count = 0;
  if (cert.has_extended_key_usage()) {
    for (const auto &key_purpose_oid : cert.extended_key_usage()) {
      eku_oid_count++;
      if (key_purpose_oid == der::Input(kAnyEKU)) {
        has_any_eku = true;
      }
      if (key_purpose_oid == der::Input(kServerAuth)) {
        has_server_auth_eku = true;
      }
      if (key_purpose_oid == der::Input(kClientAuth)) {
        has_client_auth_eku = true;
      }
      if (key_purpose_oid == der::Input(kCodeSigning)) {
        has_code_signing_eku = true;
      }
      if (key_purpose_oid == der::Input(kTimeStamping)) {
        has_time_stamping_eku = true;
      }
      if (key_purpose_oid == der::Input(kOCSPSigning)) {
        has_ocsp_signing_eku = true;
      }
      if (key_purpose_oid == der::Input(kRcsMlsClient)) {
        has_rcs_mls_client_eku = true;
      }
      if (key_purpose_oid == der::Input(kEmailProtection)) {
        has_email_protection_eku = true;
      }
      if (key_purpose_oid == der::Input(kDocumentSigning)) {
        has_document_signing_eku = true;
      }
    }
  }

  if (required_key_purpose == KeyPurpose::RCS_MLS_CLIENT_AUTH) {
    // Enforce the key usage restriction for a leaf from section A.3.8.3 here
    // as well.
    if (is_target_cert &&
        (!cert.has_key_usage() ||
         // This works to enforce that digital signature is the only bit because
         // digital signature is bit 0.
         !cert.key_usage().AssertsBit(KEY_USAGE_BIT_DIGITAL_SIGNATURE) ||
         cert.key_usage().bytes().size() != 1 ||
         cert.key_usage().unused_bits() != 7)) {
      errors->AddError(cert_errors::kKeyUsageIncorrectForRcsMlsClient);
    }
    // Rules for MLS client auth. For the leaf and all intermediates, EKU must
    // be present and have exactly one EKU which is rcsMlsClient.
    if (!cert.has_extended_key_usage()) {
      errors->AddError(cert_errors::kEkuNotPresent);
    } else if (eku_oid_count != 1 || !has_rcs_mls_client_eku) {
      errors->AddError(cert_errors::kEkuIncorrectForRcsMlsClient);
    }
    return;
  }

  if (required_key_purpose == KeyPurpose::C2PA_TIMESTAMPING) {
    // https://c2pa.org/specifications/specifications/2.1/specs/C2PA_Specification.html#_certificate_profiles
    // For time stamp signing, C2PA requires that the leaf:
    // 1) must have EKU
    // 2) must not have EKU ANY, OCSP signing, document signing, or email protection
    // 3) must have time stamping
    // 4) should tolerate other EKU's being present.
    if (is_target_cert) {
      if (!cert.has_extended_key_usage()) {
        errors->AddError(cert_errors::kEkuNotPresent);
      }
      if (has_any_eku || has_ocsp_signing_eku || has_document_signing_eku ||
          has_email_protection_eku || !has_time_stamping_eku) {
        errors->AddError(cert_errors::kEkuIncorrectForC2PATimeStamping);
      }
    }
    return;
  }

  if (required_key_purpose == KeyPurpose::C2PA_MANIFEST) {
    // https://c2pa.org/specifications/specifications/2.1/specs/C2PA_Specification.html#_certificate_profiles
    // For manifest signing, C2PA requires that the leaf:
    // 1) must have EKU
    // 2) must not have EKU ANY, time stamping, or OCSP signing
    // 3) should have document signing and/or email protection
    // 4) should tolerate other EKU's being present.
    if (is_target_cert) {
      if (!cert.has_extended_key_usage()) {
        errors->AddError(cert_errors::kEkuNotPresent);
      }
      if (!cert.has_key_usage() ||
          !cert.key_usage().AssertsBit(KEY_USAGE_BIT_DIGITAL_SIGNATURE) ||
          has_any_eku || has_ocsp_signing_eku || has_time_stamping_eku ||
          (!has_email_protection_eku && !has_document_signing_eku)) {
        errors->AddError(cert_errors::kEkuIncorrectForC2PAManifest);
      }
    }
    return;
  }

  // Rules TLS client and server authentication variants.

  // Apply strict only to leaf certificates in these cases.
  if (required_key_purpose == KeyPurpose::CLIENT_AUTH_STRICT_LEAF) {
    if (!is_target_cert) {
      required_key_purpose = KeyPurpose::CLIENT_AUTH;
    } else {
      required_key_purpose = KeyPurpose::CLIENT_AUTH_STRICT;
    }
  }

  if (required_key_purpose == KeyPurpose::SERVER_AUTH_STRICT_LEAF) {
    if (!is_target_cert) {
      required_key_purpose = KeyPurpose::SERVER_AUTH;
    } else {
      required_key_purpose = KeyPurpose::SERVER_AUTH_STRICT;
    }
  }

  auto add_error_if_strict = [&](CertErrorId id) {
    if (required_key_purpose == KeyPurpose::SERVER_AUTH_STRICT ||
        required_key_purpose == KeyPurpose::CLIENT_AUTH_STRICT) {
      errors->AddError(id);
    } else {
      errors->AddWarning(id);
    }
  };
  if (is_target_cert) {
    // Loosely based upon CABF BR version 1.8.4, 7.1.2.3(f).  We are more
    // permissive in that we still allow EKU any to be present in a leaf
    // certificate, but we ignore it for purposes of server or client auth.  We
    // are less permissive in that we prohibit Code Signing, OCSP Signing, and
    // Time Stamping which are currently only a SHOULD NOT. The BR does
    // explicitly allow Email authentication to be present, as this still exists
    // in the wild (2022), so we do not prohibit Email authentication here (and
    // by extension must allow it to be present in the signer, below).
    if (!cert.has_extended_key_usage()) {
      // This is added as a warning, an error will be added in STRICT modes
      // if we then lack client or server auth due to this not being present.
      errors->AddWarning(cert_errors::kEkuNotPresent);
    } else {
      if (has_code_signing_eku) {
        add_error_if_strict(cert_errors::kEkuHasProhibitedCodeSigning);
      }
      if (has_ocsp_signing_eku) {
        add_error_if_strict(cert_errors::kEkuHasProhibitedOCSPSigning);
      }
      if (has_time_stamping_eku) {
        add_error_if_strict(cert_errors::kEkuHasProhibitedTimeStamping);
      }
    }
  } else if (is_target_cert_issuer) {
    // Handle the decision to overload EKU as a constraint on issuers.
    //
    // CABF BR version 1.8.4, 7.1.2.2(g) pertains to the case of "Certs used to
    // issue TLS certificates", While the BR refers to the entire chain of
    // intermediates, there are a number of exceptions regarding CA ownership
    // and cross signing which are impossible for us to know or enforce here.
    // Therefore, we can only enforce at the level of the intermediate that
    // issued our target certificate. This means we we differ in the following
    // ways:
    // - We only enforce at the issuer of the TLS certificate.
    // - We allow email protection to exist in the issuer, since without
    //   this it can not be allowed in the client (other than via EKU any))
    // - As in the leaf certificate case, we allow EKU any to be present, but
    //   we ignore it for the purposes of server or client auth.
    //
    // At this time (until at least 2023) some intermediates are lacking EKU in
    // the world at large from common CA's, so we allow the noEKU case to permit
    // everything.
    // TODO(bbe): enforce requiring EKU in the issuer when we can manage it.
    if (cert.has_extended_key_usage()) {
      if (has_code_signing_eku) {
        add_error_if_strict(cert_errors::kEkuHasProhibitedCodeSigning);
      }
      if (has_time_stamping_eku) {
        add_error_if_strict(cert_errors::kEkuHasProhibitedTimeStamping);
      }
    }
  }
  // Otherwise, we are a parent of an issuer of a TLS certificate.  The CABF
  // BR version 1.8.4, 7.1.2.2(g) goes as far as permitting EKU any in certain
  // cases of Cross Signing and CA Ownership, having permitted cases where EKU
  // is permitted to not be present at all. These cases are not practical to
  // differentiate here and therefore we don't attempt to enforce any further
  // EKU "constraints" on such certificates. Unlike the above cases we also
  // allow the use of EKU any for client or server auth constraint purposes.

  switch (required_key_purpose) {
    case KeyPurpose::ANY_EKU:
    case KeyPurpose::CLIENT_AUTH_STRICT_LEAF:
    case KeyPurpose::SERVER_AUTH_STRICT_LEAF:
    case KeyPurpose::RCS_MLS_CLIENT_AUTH:
    case KeyPurpose::C2PA_TIMESTAMPING:
    case KeyPurpose::C2PA_MANIFEST:
      assert(0);  // NOTREACHED
      return;
    case KeyPurpose::SERVER_AUTH:
    case KeyPurpose::SERVER_AUTH_STRICT: {
      if (has_any_eku && !has_server_auth_eku) {
        if (is_target_cert || is_target_cert_issuer) {
          errors->AddWarning(cert_errors::kEkuLacksServerAuthButHasAnyEKU);
        } else {
          // Accept anyEKU for server auth below target issuer.
          has_server_auth_eku = true;
        }
      }
      if (is_target_cert_issuer && !cert.has_extended_key_usage()) {
        // Accept noEKU for server auth in target issuer.
        // TODO(bbe): remove this once BR requirements catch up with CA's.
        has_server_auth_eku = true;
      }
      if (required_key_purpose == KeyPurpose::SERVER_AUTH) {
        // Legacy compatible.
        if (cert.has_extended_key_usage() && !has_server_auth_eku &&
            !has_any_eku) {
          errors->AddError(cert_errors::kEkuLacksServerAuth);
        }
      } else {
        if (!has_server_auth_eku) {
          errors->AddError(cert_errors::kEkuLacksServerAuth);
        }
      }
      break;
    }
    case KeyPurpose::CLIENT_AUTH:
    case KeyPurpose::CLIENT_AUTH_STRICT: {
      if (has_any_eku && !has_client_auth_eku) {
        if (is_target_cert || is_target_cert_issuer) {
          errors->AddWarning(cert_errors::kEkuLacksClientAuthButHasAnyEKU);
        } else {
          // accept anyEKU for client auth.
          has_client_auth_eku = true;
        }
      }
      if (required_key_purpose == KeyPurpose::CLIENT_AUTH) {
        // Legacy-compatible.
        if (cert.has_extended_key_usage() && !has_client_auth_eku &&
            !has_any_eku) {
          errors->AddError(cert_errors::kEkuLacksClientAuth);
        }
      } else {
        if (!has_client_auth_eku) {
          errors->AddError(cert_errors::kEkuLacksClientAuth);
        }
      }
      break;
    }
  }
}